

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O2

void kratos::topological_sort_helper
               (GeneratorGraph *g,GeneratorNode *node,
               unordered_set<kratos::GeneratorNode_*,_std::hash<kratos::GeneratorNode_*>,_std::equal_to<kratos::GeneratorNode_*>,_std::allocator<kratos::GeneratorNode_*>_>
               *visited,queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
                        *queue)

{
  set<kratos::Generator_*,_std::less<kratos::Generator_*>,_std::allocator<kratos::Generator_*>_>
  *psVar1;
  iterator iVar2;
  _Base_ptr p_Var3;
  GeneratorNode *local_48;
  GeneratorNode *node_local;
  GeneratorNode *child_node;
  
  local_48 = node;
  child_node = (GeneratorNode *)queue;
  std::
  _Hashtable<kratos::GeneratorNode*,kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>,std::__detail::_Identity,std::equal_to<kratos::GeneratorNode*>,std::hash<kratos::GeneratorNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
  ::_M_emplace<kratos::GeneratorNode*&>
            ((_Hashtable<kratos::GeneratorNode*,kratos::GeneratorNode*,std::allocator<kratos::GeneratorNode*>,std::__detail::_Identity,std::equal_to<kratos::GeneratorNode*>,std::hash<kratos::GeneratorNode*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              *)visited,&local_48);
  psVar1 = &local_48->children;
  for (p_Var3 = (local_48->children)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(psVar1->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    node_local = GeneratorGraph::get_node(g,*(Generator **)(p_Var3 + 1));
    iVar2 = std::
            _Hashtable<kratos::GeneratorNode_*,_kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>,_std::__detail::_Identity,_std::equal_to<kratos::GeneratorNode_*>,_std::hash<kratos::GeneratorNode_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::find(&visited->_M_h,&node_local);
    if (iVar2.super__Node_iterator_base<kratos::GeneratorNode_*,_false>._M_cur == (__node_type *)0x0
       ) {
      topological_sort_helper
                (g,node_local,visited,
                 (queue<kratos::GeneratorNode_*,_std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>_>
                  *)child_node);
    }
  }
  std::deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_>::push_back
            ((deque<kratos::GeneratorNode_*,_std::allocator<kratos::GeneratorNode_*>_> *)child_node,
             &local_48);
  return;
}

Assistant:

void topological_sort_helper(GeneratorGraph *g, GeneratorNode *node,
                             std::unordered_set<GeneratorNode *> &visited,
                             std::queue<GeneratorNode *> &queue) {
    // mark it as visited
    visited.emplace(node);

    // visit all the child node
    for (auto const &child : node->children) {
        auto *child_node = g->get_node(child);
        if (visited.find(child_node) == visited.end()) {
            // visit it
            topological_sort_helper(g, child_node, visited, queue);
        }
    }
    queue.push(node);
}